

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O2

void SEM_IF(ast *node)

{
  ast *paVar1;
  attr *paVar2;
  int iVar3;
  
  paVar1 = sibling(node,2);
  paVar2 = SEM_Exp(paVar1);
  if (paVar2 != (attr *)0x0) {
    for (; iVar3 = paVar2->kind, iVar3 == 1; paVar2 = ((paVar2->field_1).array)->type) {
    }
    if (iVar3 == 3) {
      paVar2 = ((paVar2->field_1).function)->return_type;
      iVar3 = paVar2->kind;
    }
    if ((iVar3 != 0) || (((paVar2->field_1).basic)->type != 2)) {
      semerror(0xc,node->pos->first_line,semErrorMsg[0xc],"#IF/WHILE CONDITION#");
    }
    paVar1 = sibling(node,4);
    SEM_Stmt(paVar1);
    paVar1 = sibling(node,6);
    if (paVar1 != (ast *)0x0) {
      SEM_Stmt(paVar1);
      return;
    }
  }
  return;
}

Assistant:

static void SEM_IF(struct ast *node) {
    struct attr *expr_type = SEM_Exp(sibling(node, 2));
    if (expr_type == NULL)
        return;
    while (expr_type->kind == ARRAY) {
        expr_type = expr_type->array->type;
    }
    if (expr_type->kind == FUNCTION) {
        expr_type = expr_type->function->return_type;
    }
    if (expr_type->kind != BASIC || expr_type->basic->type != INT_T) { //DONETODO: check expr_type
//        printf("error if/while condition type\n");
        SEMERROR(NotInteger, node, "#IF/WHILE CONDITION#");
    }
    SEM_Stmt(sibling(node, 4));
    struct ast *sibling6 = sibling(node, 6);
    if (sibling6)
        SEM_Stmt(sibling6);
}